

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_htable_asvp.c
# Opt level: O0

void * ares_htable_asvp_get_direct(ares_htable_asvp_t *htable,ares_socket_t key)

{
  void *local_20;
  void *val;
  ares_htable_asvp_t *paStack_10;
  ares_socket_t key_local;
  ares_htable_asvp_t *htable_local;
  
  local_20 = (void *)0x0;
  val._4_4_ = key;
  paStack_10 = htable;
  ares_htable_asvp_get(htable,key,&local_20);
  return local_20;
}

Assistant:

void *ares_htable_asvp_get_direct(const ares_htable_asvp_t *htable,
                                  ares_socket_t             key)
{
  void *val = NULL;
  ares_htable_asvp_get(htable, key, &val);
  return val;
}